

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O2

void __thiscall cmComputeComponentGraph::TarjanVisit(cmComputeComponentGraph *this,size_t i)

{
  pointer pTVar1;
  pointer pcVar2;
  pointer pcVar3;
  ulong uVar4;
  _Elt_pointer puVar5;
  size_t sVar6;
  cmGraphEdge *ni;
  pointer pcVar7;
  long lVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t j;
  size_t i_local;
  
  (this->TarjanVisited).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[i] = this->TarjanWalkId;
  pTVar1 = (this->TarjanEntries).
           super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1[i].Root = i;
  (this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start[i] = 0xffffffffffffffff;
  sVar6 = this->TarjanIndex + 1;
  this->TarjanIndex = sVar6;
  pTVar1[i].VisitIndex = sVar6;
  i_local = i;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&(this->TarjanStack).c,&i_local);
  pcVar2 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
           super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = *(pointer *)&pcVar2[i_local].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
  pcVar3 = *(pointer *)((long)(pcVar2 + i_local) + 8);
  do {
    if (pcVar7 == pcVar3) {
      if ((this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[i_local].Root == i_local) {
        lVar8 = (long)(this->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_start;
        std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::emplace_back<>
                  (&this->Components);
        this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  (lVar8 + (long)(this->Components).
                                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        do {
          puVar5 = (this->TarjanStack).c.
                   super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (puVar5 == (this->TarjanStack).c.
                        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first) {
            puVar5 = (this->TarjanStack).c.
                     super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          j = puVar5[-1];
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                    (&(this->TarjanStack).c);
          (this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start[j] = lVar8 / 0x18;
          (this->TarjanEntries).
          super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[j].Root = i_local;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&j);
        } while (j != i_local);
        std::
        __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      return;
    }
    sVar6 = pcVar7->Dest;
    uVar4 = (this->TarjanVisited).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar6];
    if (uVar4 == 0) {
      TarjanVisit(this,sVar6);
LAB_004c1dbd:
      if ((this->TarjanComponents).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar6] == 0xffffffffffffffff) {
        pTVar1 = (this->TarjanEntries).
                 super__Vector_base<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar1[pTVar1[sVar6].Root].VisitIndex < pTVar1[pTVar1[i_local].Root].VisitIndex) {
          pTVar1[i_local].Root = pTVar1[sVar6].Root;
        }
      }
    }
    else if (this->TarjanWalkId <= uVar4) goto LAB_004c1dbd;
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

void cmComputeComponentGraph::TarjanVisit(size_t i)
{
  // We are now visiting this node.
  this->TarjanVisited[i] = this->TarjanWalkId;

  // Initialize the entry.
  this->TarjanEntries[i].Root = i;
  this->TarjanComponents[i] = INVALID_COMPONENT;
  this->TarjanEntries[i].VisitIndex = ++this->TarjanIndex;
  this->TarjanStack.push(i);

  // Follow outgoing edges.
  EdgeList const& nl = this->InputGraph[i];
  for (cmGraphEdge const& ni : nl) {
    size_t j = ni;

    // Ignore edges to nodes that have been reached by a previous DFS
    // walk.  Since we did not reach the current node from that walk
    // it must not belong to the same component and it has already
    // been assigned to a component.
    if (this->TarjanVisited[j] > 0 &&
        this->TarjanVisited[j] < this->TarjanWalkId) {
      continue;
    }

    // Visit the destination if it has not yet been visited.
    if (!this->TarjanVisited[j]) {
      this->TarjanVisit(j);
    }

    // If the destination has not yet been assigned to a component,
    // check if it has a better root for the current object.
    if (this->TarjanComponents[j] == INVALID_COMPONENT) {
      if (this->TarjanEntries[this->TarjanEntries[j].Root].VisitIndex <
          this->TarjanEntries[this->TarjanEntries[i].Root].VisitIndex) {
        this->TarjanEntries[i].Root = this->TarjanEntries[j].Root;
      }
    }
  }

  // Check if we have found a component.
  if (this->TarjanEntries[i].Root == i) {
    // Yes.  Create it.
    size_t c = this->Components.size();
    this->Components.emplace_back();
    NodeList& component = this->Components[c];

    // Populate the component list.
    size_t j;
    do {
      // Get the next member of the component.
      j = this->TarjanStack.top();
      this->TarjanStack.pop();

      // Assign the member to the component.
      this->TarjanComponents[j] = c;
      this->TarjanEntries[j].Root = i;

      // Store the node in its component.
      component.push_back(j);
    } while (j != i);

    // Sort the component members for clarity.
    std::sort(component.begin(), component.end());
  }
}